

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O0

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle>::TPZMultiphysicsCompEl
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle> *this,TPZCompMesh *mesh,TPZGeoEl *ref)

{
  TPZRegisterClassId *in_RDI;
  int64_t in_stack_00000008;
  TPZManVector<TPZCompElSide,_5> *in_stack_00000010;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  TPZCompMesh *in_stack_ffffffffffffffd0;
  void **vtt;
  TPZMultiphysicsElement *this_00;
  
  this_00 = (TPZMultiphysicsElement *)0x0;
  vtt = (void **)0x21;
  TPZRegisterClassId::TPZRegisterClassId<TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle>>(in_RDI,0x21)
  ;
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02501df0);
  TPZMultiphysicsElement::TPZMultiphysicsElement
            (this_00,vtt,in_stack_ffffffffffffffd0,
             (TPZGeoEl *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  *(undefined ***)in_RDI = &PTR__TPZMultiphysicsCompEl_02501ab8;
  *(undefined ***)in_RDI = &PTR__TPZMultiphysicsCompEl_02501ab8;
  TPZManVector<TPZCompElSide,_5>::TPZManVector(in_stack_00000010,in_stack_00000008);
  TPZVec<long>::TPZVec((TPZVec<long> *)(in_RDI + 0xe8));
  TPZIntTriang::TPZIntTriang((TPZIntTriang *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  return;
}

Assistant:

TPZMultiphysicsCompEl<TGeometry>::TPZMultiphysicsCompEl(TPZCompMesh &mesh, TPZGeoEl *ref) :TPZRegisterClassId(&TPZMultiphysicsCompEl::ClassId),
TPZMultiphysicsElement(mesh, ref), fElementVec(0) {
}